

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O3

void finish(warm_cb *data)

{
  action_score *paVar1;
  example *peVar2;
  float *__ptr;
  pointer pfVar3;
  ostream *poVar4;
  undefined **ppuVar5;
  ulong uVar6;
  ulong uVar7;
  pointer ppeVar8;
  long lVar9;
  float fVar10;
  vector<float,_std::allocator<float>_> local_48;
  
  (*(code *)PTR_delete_label_002e1b98)();
  paVar1 = (data->a_s)._begin;
  if (paVar1 != (action_score *)0x0) {
    free(paVar1);
  }
  (data->a_s)._begin = (action_score *)0x0;
  (data->a_s)._end = (action_score *)0x0;
  (data->a_s).end_array = (action_score *)0x0;
  std::vector<float,_std::allocator<float>_>::vector(&local_48,&data->cumulative_costs);
  if ((long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar7 = 0;
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) goto LAB_001cb6d0;
  }
  else {
    fVar10 = 3.4028235e+38;
    uVar6 = 0;
    uVar7 = 0;
    do {
      if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar6] < fVar10) {
        uVar7 = uVar6 & 0xffffffff;
        fVar10 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6];
      }
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) <
             (ulong)((long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_001cb6d0:
  if (data->all->quiet == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"average variance estimate = ",0x1c);
    poVar4 = std::ostream::_M_insert<double>((double)(data->cumu_var / (float)data->inter_iter));
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"theoretical average variance = ",0x1f);
    poVar4 = std::ostream::_M_insert<double>((double)((float)data->num_actions / data->epsilon));
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"last lambda chosen = ",0x15);
    poVar4 = std::ostream::_M_insert<double>
                       ((double)(data->lambdas).super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar7]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," among lambdas ranging from ",0x1c);
    poVar4 = std::ostream::_M_insert<double>
                       ((double)*(data->lambdas).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," to ",4);
    poVar4 = std::ostream::_M_insert<double>
                       ((double)(data->lambdas).super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start[data->choices_lambda - 1]);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if (data->num_actions != 0) {
    lVar9 = 0;
    uVar7 = 0;
    do {
      (*(code *)PTR_delete_label_002e1b08)((long)&(data->csls->costs)._begin + lVar9);
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar7 < data->num_actions);
  }
  free(data->csls);
  free(data->cbls);
  if (data->num_actions != 0) {
    uVar7 = 0;
    do {
      peVar2 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      __ptr = (peVar2->pred).scalars._begin;
      if (__ptr != (float *)0x0) {
        free(__ptr);
      }
      (peVar2->pred).scalars._begin = (float *)0x0;
      (peVar2->pred).scalars._end = (float *)0x0;
      (peVar2->pred).scalars.end_array = (float *)0x0;
      VW::dealloc_example((_func_void_void_ptr *)PTR_delete_label_002e1b98,
                          (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar7],(_func_void_void_ptr *)0x0
                         );
      peVar2 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      if (peVar2 != (example *)0x0) {
        free(peVar2);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < data->num_actions);
  }
  ppeVar8 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppeVar8 != (pointer)0x0) {
    operator_delete(ppeVar8);
  }
  pfVar3 = (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar3 != (pointer)0x0) {
    operator_delete(pfVar3);
  }
  pfVar3 = (data->cumulative_costs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar3 != (pointer)0x0) {
    operator_delete(pfVar3);
  }
  paVar1 = (data->a_s_adf)._begin;
  if (paVar1 != (action_score *)0x0) {
    free(paVar1);
  }
  (data->a_s_adf)._begin = (action_score *)0x0;
  (data->a_s_adf)._end = (action_score *)0x0;
  (data->a_s_adf).end_array = (action_score *)0x0;
  ppeVar8 = (data->ws_vali).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((data->ws_vali).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppeVar8) {
    uVar7 = 0;
    do {
      ppuVar5 = &MULTICLASS::mc_label;
      if (data->use_cs != false) {
        ppuVar5 = &COST_SENSITIVE::cs_label;
      }
      VW::dealloc_example((_func_void_void_ptr *)ppuVar5[4],ppeVar8[uVar7],
                          (_func_void_void_ptr *)0x0);
      free((data->ws_vali).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7]);
      uVar7 = uVar7 + 1;
      ppeVar8 = (data->ws_vali).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(data->ws_vali).
                                   super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
                                   .super__Vector_impl_data._M_finish - (long)ppeVar8 >> 3));
  }
  if (ppeVar8 != (pointer)0x0) {
    operator_delete(ppeVar8);
  }
  return;
}

Assistant:

void finish(warm_cb& data)
{
  CB::cb_label.delete_label(&data.cb_label);
  data.a_s.delete_v();

	uint32_t argmin = find_min(data.cumulative_costs);

  if (!data.all->quiet)
  {
  	cerr << "average variance estimate = " << data.cumu_var / data.inter_iter << endl;
  	cerr << "theoretical average variance = " << data.num_actions / data.epsilon << endl;
  	cerr << "last lambda chosen = " << data.lambdas[argmin] << " among lambdas ranging from " << data.lambdas[0] << " to " << data.lambdas[data.choices_lambda-1] << endl;
  }

	for (size_t a = 0; a < data.num_actions; ++a)
	{
		COST_SENSITIVE::cs_label.delete_label(&data.csls[a]);
	}
	free(data.csls);
	free(data.cbls);

  for (size_t a = 0; a < data.num_actions; ++a)
    {
      data.ecs[a]->pred.a_s.delete_v();
      VW::dealloc_example(CB::cb_label.delete_label, *data.ecs[a]);
      free_it(data.ecs[a]);
    }
  data.ecs.~vector<example*>();

	data.lambdas.~vector<float>();
	data.cumulative_costs.~vector<float>();

	data.a_s_adf.delete_v();
	for (size_t i = 0; i < data.ws_vali.size(); ++i)
	{
		if (data.use_cs)
			VW::dealloc_example(COST_SENSITIVE::cs_label.delete_label, *data.ws_vali[i]);
		else
			VW::dealloc_example(MULTICLASS::mc_label.delete_label, *data.ws_vali[i]);
		free(data.ws_vali[i]);
	}
	data.ws_vali.~vector<example*>();
}